

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticpyramid.cpp
# Opt level: O2

int __thiscall pzgeom::TPZQuadraticPyramid::ClassId(TPZQuadraticPyramid *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZQuadraticPyramid",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZNodeRep<13,_pztopology::TPZPyramid>::ClassId
                    (&this->super_TPZNodeRep<13,_pztopology::TPZPyramid>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZQuadraticPyramid::ClassId() const{
    return Hash("TPZQuadraticPyramid") ^ TPZNodeRep<13,pztopology::TPZPyramid>::ClassId() << 1;
}